

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

void __thiscall cmCTestRunTest::CheckOutput(cmCTestRunTest *this,string *line)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  iterator __first;
  iterator __last;
  vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  reference this_01;
  rep rVar8;
  void *this_02;
  pointer pcVar9;
  string local_730 [32];
  duration<long,_std::ratio<1L,_1L>_> local_710;
  ostringstream local_708 [8];
  ostringstream cmCTestLog_msg_3;
  pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *reg;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  ostringstream local_550 [8];
  ostringstream cmCTestLog_msg_2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_3a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *labels;
  string label;
  ostringstream local_360 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1e8;
  byte local_1c1;
  string local_1c0 [7];
  bool ctest_tag_found;
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  string *line_local;
  cmCTestRunTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  iVar3 = GetIndex(this);
  poVar4 = (ostream *)std::ostream::operator<<(local_190,iVar3);
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = std::operator<<(poVar4,(string *)line);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x2b,pcVar5,false);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  uVar6 = std::__cxx11::string::empty();
  if (((uVar6 & 1) == 0) && (lVar7 = std::__cxx11::string::find((char *)line,0xe09051), lVar7 != -1)
     ) {
    local_1c1 = 0;
    bVar2 = cmsys::RegularExpression::find(&this->TestHandler->CustomCompletionStatusRegex,line);
    if (bVar2) {
      local_1c1 = 1;
      cmsys::RegularExpression::match_abi_cxx11_
                (&local_1e8,&this->TestHandler->CustomCompletionStatusRegex,1);
      std::__cxx11::string::operator=
                ((string *)&(this->TestResult).CustomCompletionStatus,(string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::ostringstream(local_360);
      iVar3 = GetIndex(this);
      poVar4 = (ostream *)std::ostream::operator<<(local_360,iVar3);
      poVar4 = std::operator<<(poVar4,": ");
      poVar4 = std::operator<<(poVar4,"Test Details changed to \'");
      poVar4 = std::operator<<(poVar4,(string *)&(this->TestResult).CustomCompletionStatus);
      poVar4 = std::operator<<(poVar4,"\'");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x39,pcVar5,false);
      std::__cxx11::string::~string((string *)(label.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream(local_360);
    }
    else {
      bVar2 = cmsys::RegularExpression::find(&this->TestHandler->CustomLabelRegex,line);
      if (bVar2) {
        local_1c1 = 1;
        cmsys::RegularExpression::match_abi_cxx11_
                  ((string *)&labels,&this->TestHandler->CustomLabelRegex,1);
        local_3a8 = &this->TestProperties->Labels;
        local_3b8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(local_3a8);
        local_3c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end(local_3a8);
        local_3b0 = std::
                    find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                              (local_3b8,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                )local_3c0,(string *)&labels);
        local_3c8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(local_3a8);
        bVar2 = __gnu_cxx::operator==(&local_3b0,&local_3c8);
        if (bVar2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_3a8,(value_type *)&labels);
          __first = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin(local_3a8);
          __last = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(local_3a8);
          std::
          sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__first._M_current,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__last._M_current);
          std::__cxx11::ostringstream::ostringstream(local_550);
          iVar3 = GetIndex(this);
          poVar4 = (ostream *)std::ostream::operator<<(local_550,iVar3);
          poVar4 = std::operator<<(poVar4,": ");
          poVar4 = std::operator<<(poVar4,"Test Label added: \'");
          poVar4 = std::operator<<(poVar4,(string *)&labels);
          poVar4 = std::operator<<(poVar4,"\'");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                       ,0x44,pcVar5,false);
          std::__cxx11::string::~string((string *)&__range2);
          std::__cxx11::ostringstream::~ostringstream(local_550);
        }
        std::__cxx11::string::~string((string *)&labels);
      }
    }
    if ((local_1c1 & 1) != 0) {
      return;
    }
  }
  std::__cxx11::string::operator+=((string *)&this->ProcessOutput,(string *)line);
  std::__cxx11::string::operator+=((string *)&this->ProcessOutput,"\n");
  bVar2 = std::
          vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->TestProperties->TimeoutRegularExpressions);
  if (!bVar2) {
    this_00 = &this->TestProperties->TimeoutRegularExpressions;
    __end2 = std::
             vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(this_00);
    reg = (pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)std::
             vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)&reg), bVar2) {
      this_01 = __gnu_cxx::
                __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator*(&__end2);
      bVar2 = cmsys::RegularExpression::find(&this_01->first,&this->ProcessOutput);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_708);
        iVar3 = GetIndex(this);
        poVar4 = (ostream *)std::ostream::operator<<(local_708,iVar3);
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,"Test timeout changed to ");
        local_710.__r =
             (rep)std::chrono::
                  duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,double,std::ratio<1l,1l>>
                            (&this->TestProperties->AlternateTimeout);
        rVar8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_710);
        this_02 = (void *)std::ostream::operator<<(poVar4,rVar8);
        std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x5a,pcVar5,false);
        std::__cxx11::string::~string(local_730);
        std::__cxx11::ostringstream::~ostringstream(local_708);
        pcVar9 = std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator->
                           (&this->TestProcess);
        cmProcess::ResetStartTime(pcVar9);
        pcVar9 = std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator->
                           (&this->TestProcess);
        cmProcess::ChangeTimeout(pcVar9,(cmDuration)(this->TestProperties->AlternateTimeout).__r);
        std::
        vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::clear(&this->TestProperties->TimeoutRegularExpressions);
        return;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void cmCTestRunTest::CheckOutput(std::string const& line)
{
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
             this->GetIndex() << ": " << line << std::endl);

  // Check for special CTest XML tags in this line of output.
  // If any are found, this line is excluded from ProcessOutput.
  if (!line.empty() && line.find("<CTest") != std::string::npos) {
    bool ctest_tag_found = false;
    if (this->TestHandler->CustomCompletionStatusRegex.find(line)) {
      ctest_tag_found = true;
      this->TestResult.CustomCompletionStatus =
        this->TestHandler->CustomCompletionStatusRegex.match(1);
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 this->GetIndex() << ": "
                                  << "Test Details changed to '"
                                  << this->TestResult.CustomCompletionStatus
                                  << "'" << std::endl);
    } else if (this->TestHandler->CustomLabelRegex.find(line)) {
      ctest_tag_found = true;
      auto label = this->TestHandler->CustomLabelRegex.match(1);
      auto& labels = this->TestProperties->Labels;
      if (std::find(labels.begin(), labels.end(), label) == labels.end()) {
        labels.push_back(label);
        std::sort(labels.begin(), labels.end());
        cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                   this->GetIndex()
                     << ": "
                     << "Test Label added: '" << label << "'" << std::endl);
      }
    }
    if (ctest_tag_found) {
      return;
    }
  }

  this->ProcessOutput += line;
  this->ProcessOutput += "\n";

  // Check for TIMEOUT_AFTER_MATCH property.
  if (!this->TestProperties->TimeoutRegularExpressions.empty()) {
    for (auto& reg : this->TestProperties->TimeoutRegularExpressions) {
      if (reg.first.find(this->ProcessOutput)) {
        cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                   this->GetIndex()
                     << ": "
                     << "Test timeout changed to "
                     << std::chrono::duration_cast<std::chrono::seconds>(
                          this->TestProperties->AlternateTimeout)
                          .count()
                     << std::endl);
        this->TestProcess->ResetStartTime();
        this->TestProcess->ChangeTimeout(
          this->TestProperties->AlternateTimeout);
        this->TestProperties->TimeoutRegularExpressions.clear();
        break;
      }
    }
  }
}